

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.h
# Opt level: O2

void __thiscall Ptex::v2_2::PtexSeparableKernel::mergeT(PtexSeparableKernel *this,BorderMode mode)

{
  int iVar1;
  int n;
  float *p;
  float fVar2;
  
  iVar1 = this->vw;
  n = (-1 << ((this->res).vlog2 & 0x1fU)) + this->v + iVar1;
  if (mode != m_black) {
    p = this->kv + ((long)iVar1 - (long)n);
    fVar2 = accumulate(p,n);
    p[-1] = fVar2 + p[-1];
    iVar1 = this->vw;
  }
  this->vw = iVar1 - n;
  return;
}

Assistant:

void mergeT(BorderMode mode)
    {
        int w = vw + v - res.v();
        float* kp = kv + vw - w;
        if (mode != m_black)
            kp[-1] += accumulate(kp, w);
        vw -= w;
    }